

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O0

StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>
* __thiscall
llvm::
StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>
::Create<llvm::MallocAllocator>
          (StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>
           *this,StringRef Key,MallocAllocator *Allocator)

{
  StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>
  *this_00;
  char *__dest;
  char *strLen;
  char *StrBuffer;
  StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>
  *NewItem;
  size_t Alignment;
  size_t AllocSize;
  size_t KeyLength;
  MallocAllocator *Allocator_local;
  StringRef Key_local;
  
  strLen = Key.Data;
  Key_local.Length = (size_t)&Allocator_local;
  Allocator_local = (MallocAllocator *)this;
  Key_local.Data = strLen;
  this_00 = (StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>
             *)MallocAllocator::Allocate((MallocAllocator *)Key.Length,(size_t)(strLen + 0x11),8);
  if (this_00 ==
      (StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>
       *)0x0) {
    __assert_fail("NewItem && \"Unhandled out-of-memory\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringMap.h"
                  ,0xa7,
                  "static StringMapEntry<ValueTy> *llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node>>::Create(StringRef, AllocatorTy &, InitTy &&...) [ValueTy = std::unique_ptr<llbuild::buildsystem::Node>, AllocatorTy = llvm::MallocAllocator, InitTy = <>]"
                 );
  }
  StringMapEntry(this_00,(size_t)strLen);
  __dest = getKeyData(this_00);
  if (strLen != (char *)0x0) {
    memcpy(__dest,Allocator_local,(size_t)strLen);
  }
  __dest[(long)strLen] = '\0';
  return this_00;
}

Assistant:

static StringMapEntry *Create(StringRef Key, AllocatorTy &Allocator,
                                InitTy &&... InitVals) {
    size_t KeyLength = Key.size();

    // Allocate a new item with space for the string at the end and a null
    // terminator.
    size_t AllocSize = sizeof(StringMapEntry) + KeyLength + 1;
    size_t Alignment = alignof(StringMapEntry);

    StringMapEntry *NewItem =
      static_cast<StringMapEntry*>(Allocator.Allocate(AllocSize,Alignment));
    assert(NewItem && "Unhandled out-of-memory");

    // Construct the value.
    new (NewItem) StringMapEntry(KeyLength, std::forward<InitTy>(InitVals)...);

    // Copy the string information.
    char *StrBuffer = const_cast<char*>(NewItem->getKeyData());
    if (KeyLength > 0)
      memcpy(StrBuffer, Key.data(), KeyLength);
    StrBuffer[KeyLength] = 0;  // Null terminate for convenience of clients.
    return NewItem;
  }